

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O3

void P_Recalculate3DFloors(sector_t_conflict *sector)

{
  byte *pbVar1;
  TArray<lightlist_t,_lightlist_t> *this;
  uint *puVar2;
  double *pdVar3;
  extsector_t *peVar4;
  secplane_t *psVar5;
  lightlist_t *plVar6;
  short *psVar7;
  double dVar8;
  FTextureID *pFVar9;
  sector_t *psVar10;
  undefined7 uVar11;
  int iVar12;
  int iVar13;
  F3DFloor *pFVar14;
  F3DFloor *pFVar15;
  F3DFloor *pFVar16;
  FDynamicColormap *pFVar17;
  uint uVar18;
  uint uVar19;
  xfloor *other;
  uint32 uVar20;
  ulong uVar21;
  F3DFloor *__src;
  uint uVar22;
  ulong uVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  TArray<F3DFloor_*,_F3DFloor_*> oldlist;
  double local_e8;
  double local_d8;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_cc;
  TArray<F3DFloor_*,_F3DFloor_*> local_b8;
  F3DFloor *local_a0;
  short *local_98;
  FDynamicColormap *pFStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  xfloor *local_58;
  sector_t_conflict *local_50;
  short *local_48;
  undefined8 uStack_40;
  
  peVar4 = sector->e;
  other = &peVar4->XFloor;
  uVar19 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
  if (1 < uVar19) {
    local_b8.Array = (F3DFloor **)0x0;
    local_b8.Most = 0;
    local_b8.Count = 0;
    TArray<F3DFloor_*,_F3DFloor_*>::operator=(&local_b8,(TArray<F3DFloor_*,_F3DFloor_*> *)other);
    if ((peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
      (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = 0;
    }
    if (local_b8.Count != 0) {
      uVar23 = 0;
      uVar19 = local_b8.Count;
      do {
        uVar22 = (uint)uVar23;
        pFVar14 = local_b8.Array[uVar23];
        uVar18 = pFVar14->flags;
        if ((uVar18 >> 0x17 & 1) == 0) {
          if ((uVar18 >> 0x18 & 1) != 0) {
            pFVar14->flags = (uVar18 & 0xfe7ffffe) + 1;
          }
          uVar23 = (ulong)(uVar22 + 1);
        }
        else {
          operator_delete(pFVar14,0x98);
          uVar19 = local_b8.Count;
          if (uVar22 < local_b8.Count) {
            uVar19 = local_b8.Count - 1;
            local_b8.Count = uVar19;
            if (uVar22 <= uVar19 && uVar19 - uVar22 != 0) {
              memmove(local_b8.Array + uVar23,local_b8.Array + uVar23 + 1,
                      (ulong)(uVar19 - uVar22) << 3);
              uVar19 = local_b8.Count;
            }
          }
        }
      } while ((uint)uVar23 < uVar19);
      if (uVar19 != 0) {
        local_e8 = 0.0;
        pFVar14 = (F3DFloor *)0x0;
        local_d8 = 0.0;
        pFVar15 = (F3DFloor *)0x0;
        do {
          __src = *local_b8.Array;
          psVar5 = (__src->top).plane;
          dVar27 = (sector->centerspot).X;
          dVar26 = (sector->centerspot).Y;
          dVar25 = ((psVar5->normal).Y * dVar26 + psVar5->D + (psVar5->normal).X * dVar27) *
                   psVar5->negiC;
          if (uVar19 < 2) {
            uVar18 = 0;
          }
          else {
            uVar23 = 0;
            uVar21 = 1;
            do {
              psVar5 = (local_b8.Array[uVar21]->top).plane;
              dVar29 = ((psVar5->normal).Y * dVar26 + psVar5->D + (psVar5->normal).X * dVar27) *
                       psVar5->negiC;
              if (dVar25 < dVar29) {
                uVar23 = uVar21 & 0xffffffff;
                __src = local_b8.Array[uVar21];
              }
              uVar18 = (uint)uVar23;
              if (dVar29 <= dVar25) {
                dVar29 = dVar25;
              }
              dVar25 = dVar29;
              uVar21 = uVar21 + 1;
            } while (uVar19 != uVar21);
          }
          if (uVar18 < uVar19) {
            uVar19 = uVar19 - 1;
            local_b8.Count = uVar19;
            if (uVar18 <= uVar19 && uVar19 - uVar18 != 0) {
              memmove(local_b8.Array + uVar18,local_b8.Array + (ulong)uVar18 + 1,
                      (ulong)(uVar19 - uVar18) << 3);
              dVar27 = (sector->centerspot).X;
              dVar26 = (sector->centerspot).Y;
            }
          }
          uVar19 = __src->flags;
          pFVar16 = pFVar15;
          if ((uVar19 >> 0x1e & 1) == 0) {
            psVar5 = (__src->bottom).plane;
            dVar27 = (dVar26 * (psVar5->normal).Y + dVar27 * (psVar5->normal).X + psVar5->D) *
                     psVar5->negiC;
            if (((uVar19 & 1) == 0) || ((uVar19 & 0x810) == 0 && (uVar19 & 0xc) != 0)) {
              if ((pFVar15 == (F3DFloor *)0x0) || (dVar25 <= local_d8)) {
                TArray<F3DFloor_*,_F3DFloor_*>::Grow((TArray<F3DFloor_*,_F3DFloor_*> *)other,1);
                pFVar15 = __src;
                if (local_e8 <= dVar27 && pFVar14 != (F3DFloor *)0x0) {
                  dVar27 = local_e8;
                  pFVar15 = pFVar14;
                }
                uVar19 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
                (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar19] = __src;
                (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar19 + 1;
                __src = pFVar15;
                local_e8 = dVar27;
              }
              else {
                pFVar14 = (F3DFloor *)operator_new(0x98);
                memcpy(pFVar14,pFVar15,0x98);
                pFVar15->flags = pFVar15->flags & 0xfefffffe | 0x1000000;
                pbVar1 = (byte *)((long)&pFVar14->flags + 2);
                *pbVar1 = *pbVar1 | 0x80;
                uVar11 = *(undefined7 *)&(__src->top).field_0x21;
                (pFVar14->bottom).copied = (__src->top).copied;
                *(undefined7 *)&(pFVar14->bottom).field_0x21 = uVar11;
                pFVar9 = (__src->top).texture;
                psVar10 = (__src->top).model;
                iVar12 = (__src->top).isceiling;
                iVar13 = (__src->top).vindex;
                (pFVar14->bottom).plane = (__src->top).plane;
                (pFVar14->bottom).texture = pFVar9;
                (pFVar14->bottom).model = psVar10;
                (pFVar14->bottom).isceiling = iVar12;
                (pFVar14->bottom).vindex = iVar13;
                (pFVar14->bottom).copied = true;
                TArray<F3DFloor_*,_F3DFloor_*>::Grow((TArray<F3DFloor_*,_F3DFloor_*> *)other,1);
                uVar19 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
                (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar19] =
                     pFVar14;
                (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar19 + 1;
                TArray<F3DFloor_*,_F3DFloor_*>::Grow((TArray<F3DFloor_*,_F3DFloor_*> *)other,1);
                uVar19 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
                (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar19] = __src;
                (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar19 + 1;
                local_e8 = dVar27;
                if (local_d8 < dVar27) {
                  pFVar16 = (F3DFloor *)operator_new(0x98);
                  memcpy(pFVar16,pFVar15,0x98);
                  pFVar16->flags = pFVar16->flags | 0x800001;
                  uVar11 = *(undefined7 *)&(__src->bottom).field_0x21;
                  (pFVar16->top).copied = (__src->bottom).copied;
                  *(undefined7 *)&(pFVar16->top).field_0x21 = uVar11;
                  pFVar9 = (__src->bottom).texture;
                  psVar10 = (__src->bottom).model;
                  iVar12 = (__src->bottom).isceiling;
                  iVar13 = (__src->bottom).vindex;
                  (pFVar16->top).plane = (__src->bottom).plane;
                  (pFVar16->top).texture = pFVar9;
                  (pFVar16->top).model = psVar10;
                  (pFVar16->top).isceiling = iVar12;
                  (pFVar16->top).vindex = iVar13;
                  (pFVar16->top).copied = true;
                  TArray<F3DFloor_*,_F3DFloor_*>::Grow((TArray<F3DFloor_*,_F3DFloor_*> *)other,1);
                  uVar19 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
                  (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar19] =
                       pFVar16;
                  (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar19 + 1;
                  pFVar14 = __src;
                  goto LAB_003ad27c;
                }
              }
              pFVar16 = (F3DFloor *)0x0;
              pFVar14 = __src;
            }
            else if ((pFVar14 == (F3DFloor *)0x0) || (dVar25 <= local_e8)) {
              if (dVar25 < dVar27) {
                pFVar15 = (F3DFloor *)operator_new(0x98);
                memcpy(pFVar15,__src,0x98);
                __src->flags = __src->flags & 0xfefffffe | 0x1000000;
                pbVar1 = (byte *)((long)&pFVar15->flags + 2);
                *pbVar1 = *pbVar1 | 0x80;
                uVar11 = *(undefined7 *)&(__src->top).field_0x21;
                (pFVar15->bottom).copied = (__src->top).copied;
                *(undefined7 *)&(pFVar15->bottom).field_0x21 = uVar11;
                pFVar9 = (__src->top).texture;
                psVar10 = (__src->top).model;
                iVar12 = (__src->top).isceiling;
                iVar13 = (__src->top).vindex;
                (pFVar15->bottom).plane = (__src->top).plane;
                (pFVar15->bottom).texture = pFVar9;
                (pFVar15->bottom).model = psVar10;
                (pFVar15->bottom).isceiling = iVar12;
                (pFVar15->bottom).vindex = iVar13;
                (pFVar15->bottom).copied = true;
                TArray<F3DFloor_*,_F3DFloor_*>::Grow((TArray<F3DFloor_*,_F3DFloor_*> *)other,1);
                uVar19 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
                (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar19] = __src;
                (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar19 + 1;
                TArray<F3DFloor_*,_F3DFloor_*>::Grow((TArray<F3DFloor_*,_F3DFloor_*> *)other,1);
                uVar19 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
                (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar19] =
                     pFVar15;
                goto LAB_003acf48;
              }
              TArray<F3DFloor_*,_F3DFloor_*>::Grow((TArray<F3DFloor_*,_F3DFloor_*> *)other,1);
              uVar19 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
              (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar19] = __src;
              (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar19 + 1;
              pFVar16 = __src;
              local_d8 = dVar27;
            }
            else {
              TArray<F3DFloor_*,_F3DFloor_*>::Grow((TArray<F3DFloor_*,_F3DFloor_*> *)other,1);
              uVar19 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
              (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar19] = __src;
              (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar19 + 1;
              if (dVar27 <= local_e8) {
                pFVar16 = (F3DFloor *)operator_new(0x98);
                memcpy(pFVar16,__src,0x98);
                __src->flags = __src->flags & 0xfefffffe | 0x1000000;
                pbVar1 = (byte *)((long)&pFVar16->flags + 2);
                *pbVar1 = *pbVar1 | 0x80;
                uVar11 = *(undefined7 *)&(pFVar14->bottom).field_0x21;
                (pFVar16->top).copied = (pFVar14->bottom).copied;
                *(undefined7 *)&(pFVar16->top).field_0x21 = uVar11;
                pFVar9 = (pFVar14->bottom).texture;
                psVar10 = (pFVar14->bottom).model;
                iVar12 = (pFVar14->bottom).isceiling;
                iVar13 = (pFVar14->bottom).vindex;
                (pFVar16->top).plane = (pFVar14->bottom).plane;
                (pFVar16->top).texture = pFVar9;
                (pFVar16->top).model = psVar10;
                (pFVar16->top).isceiling = iVar12;
                (pFVar16->top).vindex = iVar13;
                (pFVar16->top).copied = true;
                TArray<F3DFloor_*,_F3DFloor_*>::Grow((TArray<F3DFloor_*,_F3DFloor_*> *)other,1);
                uVar19 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
                (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar19] =
                     pFVar16;
                (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar19 + 1;
                local_d8 = dVar27;
              }
              else {
                __src->flags = __src->flags & 0xfefffffe | 0x1000000;
              }
            }
          }
          else {
            TArray<F3DFloor_*,_F3DFloor_*>::Grow((TArray<F3DFloor_*,_F3DFloor_*> *)other,1);
            uVar19 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
            (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar19] = __src;
LAB_003acf48:
            (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar19 + 1;
          }
LAB_003ad27c:
          pFVar15 = pFVar16;
          uVar19 = local_b8.Count;
        } while (local_b8.Count != 0);
      }
    }
    TArray<F3DFloor_*,_F3DFloor_*>::~TArray(&local_b8);
    uVar19 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
  }
  if (uVar19 != 0) {
    this = &(peVar4->XFloor).lightlist;
    if ((peVar4->XFloor).lightlist.Count == 0) {
      TArray<lightlist_t,_lightlist_t>::Grow(this,1);
    }
    (peVar4->XFloor).lightlist.Count = 1;
    plVar6 = (peVar4->XFloor).lightlist.Array;
    (plVar6->plane).normal.Z = (sector->ceilingplane).normal.Z;
    dVar27 = (sector->ceilingplane).normal.Y;
    (plVar6->plane).normal.X = (sector->ceilingplane).normal.X;
    (plVar6->plane).normal.Y = dVar27;
    dVar27 = (sector->ceilingplane).negiC;
    (plVar6->plane).D = (sector->ceilingplane).D;
    (plVar6->plane).negiC = dVar27;
    local_48 = &sector->lightlevel;
    plVar6 = (peVar4->XFloor).lightlist.Array;
    plVar6->p_lightlevel = local_48;
    plVar6->lightsource = (F3DFloor *)0x0;
    plVar6->caster = (F3DFloor *)0x0;
    plVar6->extra_colormap = sector->ColorMap;
    (plVar6->blend).field_0.d = 0;
    plVar6 = (peVar4->XFloor).lightlist.Array;
    plVar6->flags = 0;
    if ((peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
      dVar27 = (sector->centerspot).X;
      dVar26 = (sector->centerspot).Y;
      dVar25 = ((sector->ceilingplane).normal.Y * dVar26 +
               (sector->ceilingplane).normal.X * dVar27 + (sector->ceilingplane).D) *
               (sector->ceilingplane).negiC;
      dVar27 = (dVar26 * (sector->floorplane).normal.Y +
               dVar27 * (sector->floorplane).normal.X + (sector->floorplane).D) *
               (sector->floorplane).negiC;
      local_a0 = plVar6->lightsource;
      local_cc = (plVar6->blend).field_0;
      local_98 = plVar6->p_lightlevel;
      pFStack_90 = plVar6->extra_colormap;
      uStack_40 = 0;
      uVar23 = 0;
      local_58 = other;
      local_50 = sector;
      do {
        pFVar14 = (other->ffloors).super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar23];
        uVar19 = pFVar14->flags;
        if ((uVar19 & 0x21) == 1) {
          psVar5 = (pFVar14->top).plane;
          dVar26 = (psVar5->normal).X;
          dVar29 = (psVar5->normal).Y;
          dVar24 = (sector->centerspot).X;
          dVar8 = (sector->centerspot).Y;
          dVar28 = (dVar29 * dVar8 + psVar5->D + dVar26 * dVar24) * psVar5->negiC;
          if (dVar28 < dVar27) {
            return;
          }
          if (dVar25 <= dVar28) {
            psVar5 = (pFVar14->bottom).plane;
            if ((dVar8 * (psVar5->normal).Y + psVar5->D + dVar24 * (psVar5->normal).X) *
                psVar5->negiC < dVar25) {
              plVar6 = this->Array;
              plVar6->p_lightlevel = pFVar14->toplightlevel;
              plVar6->caster = pFVar14;
              plVar6->lightsource = pFVar14;
              pFVar17 = F3DFloor::GetColormap(pFVar14);
              plVar6 = this->Array;
              plVar6->extra_colormap = pFVar17;
              if (((pFVar14->flags & 0x8000000) != 0) ||
                 (uVar20 = (pFVar14->model->ColorMap->Fade).field_0.d,
                 (pFVar14->target->ColorMap->Fade).field_0.d == uVar20)) {
                uVar20 = 0;
              }
              (plVar6->blend).field_0.d = uVar20;
              uVar19 = pFVar14->flags;
              this->Array->flags = uVar19;
            }
          }
          else {
            local_88 = (psVar5->normal).Z;
            local_68 = psVar5->D;
            dStack_60 = psVar5->negiC;
            psVar7 = pFVar14->toplightlevel;
            local_78 = dVar26;
            dStack_70 = dVar29;
            pFVar17 = F3DFloor::GetColormap(pFVar14);
            uVar19 = pFVar14->flags;
            if (((uVar19 >> 0x1b & 1) != 0) ||
               (uVar20 = (pFVar14->model->ColorMap->Fade).field_0.d,
               (pFVar14->target->ColorMap->Fade).field_0.d == uVar20)) {
              uVar20 = 0;
            }
            TArray<lightlist_t,_lightlist_t>::Grow(this,1);
            plVar6 = (peVar4->XFloor).lightlist.Array;
            uVar18 = (peVar4->XFloor).lightlist.Count;
            plVar6[uVar18].plane.normal.X = local_78;
            plVar6[uVar18].plane.normal.Y = dStack_70;
            plVar6[uVar18].plane.normal.Z = local_88;
            pdVar3 = &plVar6[uVar18].plane.D;
            *pdVar3 = local_68;
            pdVar3[1] = dStack_60;
            plVar6[uVar18].p_lightlevel = psVar7;
            plVar6[uVar18].extra_colormap = pFVar17;
            plVar6[uVar18].blend.field_0.d = uVar20;
            plVar6[uVar18].flags = uVar19;
            plVar6[uVar18].lightsource = pFVar14;
            plVar6[uVar18].caster = pFVar14;
            puVar2 = &(peVar4->XFloor).lightlist.Count;
            *puVar2 = *puVar2 + 1;
            uVar19 = pFVar14->flags;
            other = local_58;
            sector = local_50;
          }
          if ((uVar19 & 0x80010000) == 0) {
            plVar6 = (peVar4->XFloor).lightlist.Array;
            uVar18 = (peVar4->XFloor).lightlist.Count - 1;
            local_98 = plVar6[uVar18].p_lightlevel;
            pFStack_90 = (FDynamicColormap *)(&plVar6[uVar18].p_lightlevel)[1];
            local_cc = plVar6[uVar18].blend.field_0;
            local_a0 = plVar6[uVar18].lightsource;
          }
          else if ((int)uVar19 < 0) {
            pFStack_90 = sector->ColorMap;
            local_98 = local_48;
            local_a0 = (F3DFloor *)0x0;
            local_cc.d = 0;
          }
          if ((uVar19 >> 0x10 & 1) != 0) {
            psVar5 = (pFVar14->bottom).plane;
            dVar26 = (psVar5->normal).X;
            dVar29 = (psVar5->normal).Y;
            dVar24 = ((sector->centerspot).Y * dVar29 + psVar5->D + (sector->centerspot).X * dVar26)
                     * psVar5->negiC;
            if ((dVar24 < dVar25) && (dVar27 < dVar24)) {
              local_78 = (psVar5->normal).Z;
              local_68 = psVar5->D;
              dStack_60 = psVar5->negiC;
              local_88 = dVar26;
              dStack_80 = dVar29;
              TArray<lightlist_t,_lightlist_t>::Grow(this,1);
              plVar6 = (peVar4->XFloor).lightlist.Array;
              uVar18 = (peVar4->XFloor).lightlist.Count;
              plVar6[uVar18].plane.normal.X = local_88;
              plVar6[uVar18].plane.normal.Y = dStack_80;
              plVar6[uVar18].plane.normal.Z = local_78;
              pdVar3 = &plVar6[uVar18].plane.D;
              *pdVar3 = local_68;
              pdVar3[1] = dStack_60;
              plVar6[uVar18].p_lightlevel = local_98;
              (&plVar6[uVar18].p_lightlevel)[1] = (short *)pFStack_90;
              plVar6[uVar18].blend.field_0 = local_cc;
              plVar6[uVar18].flags = uVar19;
              plVar6[uVar18].lightsource = local_a0;
              plVar6[uVar18].caster = pFVar14;
              puVar2 = &(peVar4->XFloor).lightlist.Count;
              *puVar2 = *puVar2 + 1;
            }
          }
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 < (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count);
    }
  }
  return;
}

Assistant:

void P_Recalculate3DFloors(sector_t * sector)
{
	F3DFloor *		rover;
	F3DFloor *		pick;
	unsigned		pickindex;
	F3DFloor *		clipped=NULL;
	F3DFloor *		solid=NULL;
	double			solid_bottom=0;
	double			clipped_top;
	double			clipped_bottom=0;
	double			maxheight, minheight;
	unsigned		i, j;
	lightlist_t newlight;
	lightlist_t resetlight;	// what it goes back to after FF_DOUBLESHADOW

	TArray<F3DFloor*> & ffloors=sector->e->XFloor.ffloors;
	TArray<lightlist_t> & lightlist = sector->e->XFloor.lightlist;

	// Sort the floors top to bottom for quicker access here and later
	// Translucent and swimmable floors are split if they overlap with solid ones.
	if (ffloors.Size()>1)
	{
		TArray<F3DFloor*> oldlist;
		
		oldlist = ffloors;
		ffloors.Clear();

		// first delete the old dynamic stuff
		for(i=0;i<oldlist.Size();i++)
		{
			F3DFloor * rover=oldlist[i];

			if (rover->flags&FF_DYNAMIC)
			{
				delete rover;
				oldlist.Delete(i);
				i--;
				continue;
			}
			if (rover->flags&FF_CLIPPED)
			{
				rover->flags&=~FF_CLIPPED;
				rover->flags|=FF_EXISTS;
			}
		}

		while (oldlist.Size())
		{
			pick=oldlist[0];
			double height=pick->top.plane->ZatPoint(sector->centerspot);

			// find highest starting ffloor - intersections are not supported!
			pickindex=0;
			for (j=1;j<oldlist.Size();j++)
			{
				double h2=oldlist[j]->top.plane->ZatPoint(sector->centerspot);

				if (h2>height)
				{
					pick=oldlist[j];
					pickindex=j;
					height=h2;
				}
			}

			oldlist.Delete(pickindex);
			double pick_bottom=pick->bottom.plane->ZatPoint(sector->centerspot);

			if (pick->flags & FF_THISINSIDE)
			{
				// These have the floor higher than the ceiling and cannot be processed
				// by the clipping code below.
				ffloors.Push(pick);
			}
			else if ((pick->flags&(FF_SWIMMABLE|FF_TRANSLUCENT) || (!(pick->flags&FF_RENDERALL))) && pick->flags&FF_EXISTS)
			{
				// We must check if this nonsolid segment gets clipped from the top by another 3D floor
				if (solid != NULL && solid_bottom < height)
				{
					ffloors.Push(pick);
					if (solid_bottom < pick_bottom)
					{
						// this one is fully covered
						pick->flags|=FF_CLIPPED;
						pick->flags&=~FF_EXISTS;
					}
					else
					{
						F3DFloor * dyn=new F3DFloor;
						*dyn=*pick;
						pick->flags|=FF_CLIPPED;
						pick->flags&=~FF_EXISTS;
						dyn->flags|=FF_DYNAMIC;
						dyn->top.copyPlane(&solid->bottom);
						ffloors.Push(dyn);

						clipped = dyn;
						clipped_top = solid_bottom;
						clipped_bottom = pick_bottom;
					}
				}
				else if (pick_bottom > height)	// do not allow inverted planes
				{
					F3DFloor * dyn = new F3DFloor;
					*dyn = *pick;
					pick->flags |= FF_CLIPPED;
					pick->flags &= ~FF_EXISTS;
					dyn->flags |= FF_DYNAMIC;
					dyn->bottom.copyPlane(&pick->top);
					ffloors.Push(pick);
					ffloors.Push(dyn);
				}
				else
				{
					clipped = pick;
					clipped_top = height;
					clipped_bottom = pick_bottom;
					ffloors.Push(pick);
				}
			}
			else if (clipped && clipped_bottom<height)
			{
				// translucent floor above must be clipped to this one!
				F3DFloor * dyn=new F3DFloor;
				*dyn=*clipped;
				clipped->flags|=FF_CLIPPED;
				clipped->flags&=~FF_EXISTS;
				dyn->flags|=FF_DYNAMIC;
				dyn->bottom.copyPlane(&pick->top);
				ffloors.Push(dyn);
				ffloors.Push(pick);

				if (pick_bottom<=clipped_bottom)
				{
					clipped=NULL;
				}
				else
				{
					// the translucent part extends below the clipper
					dyn=new F3DFloor;
					*dyn=*clipped;
					dyn->flags|=FF_DYNAMIC|FF_EXISTS;
					dyn->top.copyPlane(&pick->bottom);
					ffloors.Push(dyn);
					clipped = dyn;
					clipped_top = pick_bottom;
				}
				solid = pick;
				solid_bottom = pick_bottom;
			}
			else
			{
				clipped = NULL;
				if (solid == NULL || solid_bottom > pick_bottom)
				{
					// only if this one is lower
					solid = pick;
					solid_bottom = pick_bottom;
				}
				ffloors.Push(pick);

			}

		}
	}

	// having the floors sorted makes this routine significantly simpler
	// Only some overlapping cases with FF_DOUBLESHADOW might create anomalies
	// but these are clearly undefined.
	if(ffloors.Size())
	{
		lightlist.Resize(1);
		lightlist[0].plane = sector->ceilingplane;
		lightlist[0].p_lightlevel = &sector->lightlevel;
		lightlist[0].caster = NULL;
		lightlist[0].lightsource = NULL;
		lightlist[0].extra_colormap = sector->ColorMap;
		lightlist[0].blend = 0;
		lightlist[0].flags = 0;

		resetlight = lightlist[0];

		maxheight = sector->ceilingplane.ZatPoint(sector->centerspot);
		minheight = sector->floorplane.ZatPoint(sector->centerspot);
		for(i = 0; i < ffloors.Size(); i++)
		{
			rover=ffloors[i];

			if ( !(rover->flags & FF_EXISTS) || rover->flags & FF_NOSHADE )
				continue;
				
			double ff_top=rover->top.plane->ZatPoint(sector->centerspot);
			if (ff_top < minheight) break;	// reached the floor
			if (ff_top < maxheight)
			{
				newlight.plane = *rover->top.plane;
				newlight.p_lightlevel = rover->toplightlevel;
				newlight.caster = rover;
				newlight.lightsource = rover;
				newlight.extra_colormap = rover->GetColormap();
				newlight.blend = rover->GetBlend();
				newlight.flags = rover->flags;
				lightlist.Push(newlight);
			}
			else
			{
				double ff_bottom=rover->bottom.plane->ZatPoint(sector->centerspot);
				if (ff_bottom<maxheight)
				{
					// this segment begins over the ceiling and extends beyond it
					lightlist[0].p_lightlevel = rover->toplightlevel;
					lightlist[0].caster = rover;
					lightlist[0].lightsource = rover;
					lightlist[0].extra_colormap = rover->GetColormap();
					lightlist[0].blend = rover->GetBlend();
					lightlist[0].flags = rover->flags;
				}
			}
			if (!(rover->flags & (FF_DOUBLESHADOW | FF_RESET)))
			{
				resetlight = lightlist.Last();
			}
			else if (rover->flags & FF_RESET)
			{
				resetlight.p_lightlevel = &sector->lightlevel;
				resetlight.lightsource = NULL;
				resetlight.extra_colormap = sector->ColorMap;
				resetlight.blend = 0;
			}

			if (rover->flags&FF_DOUBLESHADOW)
			{
				double ff_bottom=rover->bottom.plane->ZatPoint(sector->centerspot);
				if(ff_bottom < maxheight && ff_bottom>minheight)
				{
					newlight.caster = rover;
					newlight.plane = *rover->bottom.plane;
					newlight.lightsource = resetlight.lightsource;
					newlight.p_lightlevel = resetlight.p_lightlevel;
					newlight.extra_colormap = resetlight.extra_colormap;
					newlight.blend = resetlight.blend;
					newlight.flags = rover->flags;
					lightlist.Push(newlight);
				}
			}
		}
	}
}